

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
TransferList(InnerMap *this,void **table,size_type index)

{
  Node *pNVar1;
  size_type b;
  Node *node;
  iterator local_40;
  
  node = (Node *)table[index];
  do {
    pNVar1 = node->next;
    b = BucketNumber(this,(TrivialKey *)node);
    InsertUnique(&local_40,this,b,node);
    node = pNVar1;
  } while (pNVar1 != (Node *)0x0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(*KeyPtrFromNodePtr(node)), node);
        node = next;
      } while (node != nullptr);
    }